

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  PathTest *this;
  int test_id;
  TestRunner runner;
  TestSuite ts;
  
  TestRunner::TestRunner(&runner,*argv);
  TestSuite::TestSuite(&ts);
  for (test_id = 1; test_id != 10; test_id = test_id + 1) {
    this = (PathTest *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                        ,0x174);
    PathTest::PathTest(this,test_id);
    TestSuite::AddTestCase(&ts,(TestCase *)this);
  }
  TestRunner::RunAll(&runner,&ts);
  TestSuite::~TestSuite(&ts);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
	TestRunner runner( argv[ 0 ] );
	TestSuite ts;
	
	for ( int i = 0; i < PathTest::gNumberOfTests; i++ )
	{
		ts.AddTestCase( jh_new PathTest( i + 1 ) );
	}
	
	runner.RunAll( ts );
	
	return 0;
}